

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::Builtins::registerMathFuncs(Builtins *this)

{
  BVFKind local_1ec;
  SourceLocation local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  undefined4 local_1cc;
  element_type *local_1c8;
  undefined1 auStack_1c0 [16];
  undefined1 auStack_1b0 [16];
  undefined1 auStack_1a0 [16];
  undefined1 auStack_190 [16];
  undefined1 auStack_180 [16];
  undefined1 auStack_170 [16];
  undefined1 auStack_160 [16];
  undefined1 auStack_150 [16];
  undefined1 auStack_140 [16];
  undefined1 auStack_130 [16];
  undefined1 auStack_120 [16];
  undefined1 auStack_110 [16];
  undefined1 auStack_100 [16];
  undefined1 auStack_f0 [16];
  undefined1 auStack_e0 [16];
  undefined1 auStack_d0 [16];
  undefined1 auStack_c0 [16];
  undefined1 auStack_b0 [16];
  undefined1 auStack_a0 [16];
  undefined1 auStack_90 [16];
  undefined1 auStack_80 [16];
  undefined1 auStack_70 [16];
  undefined1 auStack_60 [16];
  undefined1 auStack_50 [16];
  undefined1 auStack_40 [16];
  undefined1 auStack_30 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  std::make_shared<slang::ast::builtins::Clog2Function>();
  auStack_30._8_8_ = local_1e8;
  _Stack_20._M_pi = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_30 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  std::make_shared<slang::ast::builtins::CountBitsFunction>();
  auStack_40._8_8_ = local_1e8;
  auStack_30._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_40 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  std::make_shared<slang::ast::builtins::CountOnesFunction>();
  auStack_50._8_8_ = local_1e8;
  auStack_40._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_50 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x1f;
  local_1cc = 0;
  std::
  make_shared<slang::ast::builtins::BooleanBitVectorFunction,slang::parsing::KnownSystemName,slang::ast::builtins::BooleanBitVectorFunction::BVFKind>
            ((KnownSystemName *)&local_1e8,&local_1ec);
  auStack_60._8_8_ = local_1e8;
  auStack_50._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_60 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x20;
  local_1cc = 1;
  std::
  make_shared<slang::ast::builtins::BooleanBitVectorFunction,slang::parsing::KnownSystemName,slang::ast::builtins::BooleanBitVectorFunction::BVFKind>
            ((KnownSystemName *)&local_1e8,&local_1ec);
  auStack_70._8_8_ = local_1e8;
  auStack_60._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_70 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x21;
  local_1cc = 2;
  std::
  make_shared<slang::ast::builtins::BooleanBitVectorFunction,slang::parsing::KnownSystemName,slang::ast::builtins::BooleanBitVectorFunction::BVFKind>
            ((KnownSystemName *)&local_1e8,&local_1ec);
  auStack_80._8_8_ = local_1e8;
  auStack_70._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_80 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x22;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&log>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_90._8_8_ = local_1e8;
  auStack_80._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_90 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x23;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&log10>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_a0._8_8_ = local_1e8;
  auStack_90._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_a0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x24;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&exp>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_b0._8_8_ = local_1e8;
  auStack_a0._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_b0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x25;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&sqrt>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_c0._8_8_ = local_1e8;
  auStack_b0._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_c0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x26;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&floor>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_d0._8_8_ = local_1e8;
  auStack_c0._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_d0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x27;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&ceil>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_e0._8_8_ = local_1e8;
  auStack_d0._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_e0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x28;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&sin>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_f0._8_8_ = local_1e8;
  auStack_e0._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_f0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x29;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&cos>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_100._8_8_ = local_1e8;
  auStack_f0._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_100 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x2a;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&tan>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_110._8_8_ = local_1e8;
  auStack_100._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_110 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_100);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x2b;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&asin>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_120._8_8_ = local_1e8;
  auStack_110._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_120 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x2c;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&acos>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_130._8_8_ = local_1e8;
  auStack_120._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_130 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_120);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x2d;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&atan>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_140._8_8_ = local_1e8;
  auStack_130._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_140 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_130);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x2e;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&sinh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_150._8_8_ = local_1e8;
  auStack_140._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_150 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x2f;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&cosh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_160._8_8_ = local_1e8;
  auStack_150._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_160 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_150);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x30;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&tanh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_170._8_8_ = local_1e8;
  auStack_160._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_170 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x31;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&asinh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_180._8_8_ = local_1e8;
  auStack_170._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_180 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_170);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x32;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&acosh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_190._8_8_ = local_1e8;
  auStack_180._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_190 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_180);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x33;
  std::
  make_shared<slang::ast::builtins::RealMath1Function<&atanh>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_1a0._8_8_ = local_1e8;
  auStack_190._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_1a0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_190);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x34;
  std::
  make_shared<slang::ast::builtins::RealMath2Function<&pow>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_1b0._8_8_ = local_1e8;
  auStack_1a0._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_1b0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x35;
  std::
  make_shared<slang::ast::builtins::RealMath2Function<&atan2>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  auStack_1c0._8_8_ = local_1e8;
  auStack_1b0._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)(auStack_1c0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_1b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  local_1ec = 0x36;
  std::
  make_shared<slang::ast::builtins::RealMath2Function<&hypot>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((Builtins *)&local_1e8,(KnownSystemName *)this);
  local_1c8 = (element_type *)local_1e8;
  auStack_1c0._0_8_ = _Stack_1e0._M_pi;
  local_1e8 = (SourceLocation)0x0;
  _Stack_1e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addSystemSubroutine(this,(shared_ptr<slang::ast::SystemSubroutine> *)&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_1c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1e0);
  return;
}

Assistant:

void Builtins::registerMathFuncs() {
    using parsing::KnownSystemName;

    addSystemSubroutine(std::make_shared<Clog2Function>());
    addSystemSubroutine(std::make_shared<CountBitsFunction>());
    addSystemSubroutine(std::make_shared<CountOnesFunction>());

#define REGISTER(name, kind) \
    addSystemSubroutine(     \
        std::make_shared<BooleanBitVectorFunction>(name, BooleanBitVectorFunction::kind))

    REGISTER(KnownSystemName::OneHot, OneHot);
    REGISTER(KnownSystemName::OneHot0, OneHot0);
    REGISTER(KnownSystemName::IsUnknown, IsUnknown);

#undef REGISTER
#define REGISTER(name, func) \
    addSystemSubroutine(std::make_shared<RealMath1Function<(func)>>(*this, name))

    REGISTER(KnownSystemName::Ln, std::log);
    REGISTER(KnownSystemName::Log10, std::log10);
    REGISTER(KnownSystemName::Exp, std::exp);
    REGISTER(KnownSystemName::Sqrt, std::sqrt);
    REGISTER(KnownSystemName::Floor, std::floor);
    REGISTER(KnownSystemName::Ceil, std::ceil);
    REGISTER(KnownSystemName::Sin, std::sin);
    REGISTER(KnownSystemName::Cos, std::cos);
    REGISTER(KnownSystemName::Tan, std::tan);
    REGISTER(KnownSystemName::Asin, std::asin);
    REGISTER(KnownSystemName::Acos, std::acos);
    REGISTER(KnownSystemName::Atan, std::atan);
    REGISTER(KnownSystemName::Sinh, std::sinh);
    REGISTER(KnownSystemName::Cosh, std::cosh);
    REGISTER(KnownSystemName::Tanh, std::tanh);
    REGISTER(KnownSystemName::Asinh, std::asinh);
    REGISTER(KnownSystemName::Acosh, std::acosh);
    REGISTER(KnownSystemName::Atanh, std::atanh);

#undef REGISTER
#define REGISTER(name, func) \
    addSystemSubroutine(std::make_shared<RealMath2Function<(func)>>(*this, name))

    REGISTER(KnownSystemName::Pow, std::pow);
    REGISTER(KnownSystemName::Atan2, std::atan2);
    REGISTER(KnownSystemName::Hypot, std::hypot);

#undef REGISTER
}